

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::CwiseMultiply::backward_impl
          (CwiseMultiply *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  pointer ppTVar5;
  Tensor *pTVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  uint uVar20;
  Index size;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar21;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x6f2,
                  "virtual void cnn::CwiseMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar5 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (i == 0) {
    pTVar6 = ppTVar5[1];
    uVar21 = (ulong)(pTVar6->d).nd;
    iVar19 = 1;
    iVar22 = 1;
    if (uVar21 != 0) {
      uVar24 = 0;
      do {
        iVar22 = iVar22 * (pTVar6->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    uVar23 = iVar22 * (pTVar6->d).bd;
    uVar21 = (ulong)(dEdf->d).nd;
    if (uVar21 != 0) {
      iVar19 = 1;
      uVar24 = 0;
      do {
        iVar19 = iVar19 * (dEdf->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    if (iVar19 * (dEdf->d).bd != uVar23) goto LAB_001a7d1c;
    uVar21 = (ulong)(dEdxi->d).nd;
    iVar19 = 1;
    if (uVar21 != 0) {
      uVar24 = 0;
      do {
        iVar19 = iVar19 * (dEdxi->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    uVar20 = iVar19 * (dEdxi->d).bd;
    uVar21 = (ulong)uVar20;
    if (uVar20 != uVar23) goto LAB_001a7d3b;
    pfVar7 = dEdxi->v;
    uVar24 = uVar21;
    if ((((ulong)pfVar7 & 3) == 0) &&
       (uVar24 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 3), uVar21 <= uVar24)) {
      uVar24 = uVar21;
    }
    pfVar8 = pTVar6->v;
    pfVar9 = dEdf->v;
    uVar26 = uVar21 - uVar24;
    uVar25 = uVar26 + 3;
    if (-1 < (long)uVar26) {
      uVar25 = uVar26;
    }
    if (uVar24 != 0) {
      uVar27 = 0;
      do {
        pfVar7[uVar27] = pfVar9[uVar27] * pfVar8[uVar27] + pfVar7[uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar24 != uVar27);
    }
    uVar25 = (uVar25 & 0xfffffffffffffffc) + uVar24;
    if (3 < (long)uVar26) {
      do {
        pfVar1 = pfVar9 + uVar24;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar2 = pfVar8 + uVar24;
        fVar13 = pfVar2[1];
        fVar14 = pfVar2[2];
        fVar15 = pfVar2[3];
        pfVar3 = pfVar7 + uVar24;
        fVar16 = pfVar3[1];
        fVar17 = pfVar3[2];
        fVar18 = pfVar3[3];
        pfVar4 = pfVar7 + uVar24;
        *pfVar4 = *pfVar2 * *pfVar1 + *pfVar3;
        pfVar4[1] = fVar13 * fVar10 + fVar16;
        pfVar4[2] = fVar14 * fVar11 + fVar17;
        pfVar4[3] = fVar15 * fVar12 + fVar18;
        uVar24 = uVar24 + 4;
      } while ((long)uVar24 < (long)uVar25);
    }
    if ((long)uVar25 < (long)uVar21) {
      do {
        pfVar7[uVar25] = pfVar9[uVar25] * pfVar8[uVar25] + pfVar7[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar21 != uVar25);
    }
  }
  else {
    pTVar6 = *ppTVar5;
    uVar21 = (ulong)(pTVar6->d).nd;
    iVar19 = 1;
    iVar22 = 1;
    if (uVar21 != 0) {
      uVar24 = 0;
      do {
        iVar22 = iVar22 * (pTVar6->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    uVar23 = iVar22 * (pTVar6->d).bd;
    uVar21 = (ulong)(dEdf->d).nd;
    if (uVar21 != 0) {
      iVar19 = 1;
      uVar24 = 0;
      do {
        iVar19 = iVar19 * (dEdf->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    if (iVar19 * (dEdf->d).bd != uVar23) {
LAB_001a7d1c:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                   );
    }
    uVar21 = (ulong)(dEdxi->d).nd;
    iVar19 = 1;
    if (uVar21 != 0) {
      uVar24 = 0;
      do {
        iVar19 = iVar19 * (dEdxi->d).d[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar21 != uVar24);
    }
    uVar20 = iVar19 * (dEdxi->d).bd;
    uVar21 = (ulong)uVar20;
    if (uVar20 != uVar23) {
LAB_001a7d3b:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                   );
    }
    pfVar7 = dEdxi->v;
    uVar24 = uVar21;
    if ((((ulong)pfVar7 & 3) == 0) &&
       (uVar24 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 3), uVar21 <= uVar24)) {
      uVar24 = uVar21;
    }
    pfVar8 = pTVar6->v;
    pfVar9 = dEdf->v;
    uVar26 = uVar21 - uVar24;
    uVar25 = uVar26 + 3;
    if (-1 < (long)uVar26) {
      uVar25 = uVar26;
    }
    if (uVar24 != 0) {
      uVar27 = 0;
      do {
        pfVar7[uVar27] = pfVar9[uVar27] * pfVar8[uVar27] + pfVar7[uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar24 != uVar27);
    }
    uVar25 = (uVar25 & 0xfffffffffffffffc) + uVar24;
    if (3 < (long)uVar26) {
      do {
        pfVar1 = pfVar9 + uVar24;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar2 = pfVar8 + uVar24;
        fVar13 = pfVar2[1];
        fVar14 = pfVar2[2];
        fVar15 = pfVar2[3];
        pfVar3 = pfVar7 + uVar24;
        fVar16 = pfVar3[1];
        fVar17 = pfVar3[2];
        fVar18 = pfVar3[3];
        pfVar4 = pfVar7 + uVar24;
        *pfVar4 = *pfVar2 * *pfVar1 + *pfVar3;
        pfVar4[1] = fVar13 * fVar10 + fVar16;
        pfVar4[2] = fVar14 * fVar11 + fVar17;
        pfVar4[3] = fVar15 * fVar12 + fVar18;
        uVar24 = uVar24 + 4;
      } while ((long)uVar24 < (long)uVar25);
    }
    if ((long)uVar25 < (long)uVar21) {
      do {
        pfVar7[uVar25] = pfVar9[uVar25] * pfVar8[uVar25] + pfVar7[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar21 != uVar25);
    }
  }
  return;
}

Assistant:

void CwiseMultiply::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < 2);
  if (i == 0) {
#if HAVE_CUDA
    gpu::vcwise_product_backward(fx.d.size(), dEdf.v, xs[1]->v, dEdxi.v);
#else
    auto x2 = xs[1]->vec();
    dEdxi.vec() += dEdf.vec().cwiseProduct(x2);
#endif
  } else {
#if HAVE_CUDA
    gpu::vcwise_product_backward(fx.d.size(), dEdf.v, xs[0]->v, dEdxi.v);
#else
    auto x1 = xs[0]->vec();
    dEdxi.vec() += dEdf.vec().cwiseProduct(x1);
#endif
  }
}